

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Vdbe * sqlite3VdbeCreate(Parse *pParse)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  Vdbe *p;
  
  db = pParse->db;
  p = (Vdbe *)sqlite3DbMallocRawNN(db,0x130);
  if (p == (Vdbe *)0x0) {
    p = (Vdbe *)0x0;
  }
  else {
    memset(&p->aOp,0,0xa8);
    p->db = db;
    pVVar1 = db->pVdbe;
    if (pVVar1 != (Vdbe *)0x0) {
      pVVar1->ppVPrev = &p->pVNext;
    }
    p->pVNext = pVVar1;
    p->ppVPrev = &db->pVdbe;
    db->pVdbe = p;
    p->pParse = pParse;
    pParse->pVdbe = p;
    sqlite3VdbeAddOp3(p,8,0,1,0);
  }
  return p;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3VdbeCreate(Parse *pParse){
  sqlite3 *db = pParse->db;
  Vdbe *p;
  p = sqlite3DbMallocRawNN(db, sizeof(Vdbe) );
  if( p==0 ) return 0;
  memset(&p->aOp, 0, sizeof(Vdbe)-offsetof(Vdbe,aOp));
  p->db = db;
  if( db->pVdbe ){
    db->pVdbe->ppVPrev = &p->pVNext;
  }
  p->pVNext = db->pVdbe;
  p->ppVPrev = &db->pVdbe;
  db->pVdbe = p;
  assert( p->eVdbeState==VDBE_INIT_STATE );
  p->pParse = pParse;
  pParse->pVdbe = p;
  assert( pParse->aLabel==0 );
  assert( pParse->nLabel==0 );
  assert( p->nOpAlloc==0 );
  assert( pParse->szOpAlloc==0 );
  sqlite3VdbeAddOp2(p, OP_Init, 0, 1);
  return p;
}